

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
* dgrminer::find_maximal_subsets_of_ndve
            (vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
             *__return_storage_ptr__,
            vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
            *sets)

{
  pointer pnVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  ulong uVar7;
  pointer pnVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  __normal_iterator<dgrminer::non_dummy_vertices_and_edges_*,_std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>
  __i;
  pointer pnVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  newbucked_ndve;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  buckets;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  output;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  bucket_ndve;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bucket;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vectors;
  vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  buckets_ndve;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  testBucket;
  vector<int,_std::allocator<int>_> currentSet;
  vector<int,_std::allocator<int>_> vec;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  currentBucket_ndve;
  vector<int,_std::allocator<int>_> testSet;
  ulong local_1f0;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  local_1e8;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_1c8;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  local_1a8;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  local_188;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_168;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_148;
  vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  local_128;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  *local_d8;
  ulong local_d0;
  undefined1 local_c8 [8];
  pointer pvStack_c0;
  _Base_ptr local_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_1a8.
  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.
  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pnVar8 = (sets->
           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pnVar1 = (sets->
           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)pnVar1 - (long)pnVar8 >> 5) * -0x5555555555555555;
  if (uVar4 < 2) {
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_start = pnVar8;
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_finish = pnVar1;
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (sets->
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (sets->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (sets->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (sets->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_d8 = __return_storage_ptr__;
    if (pnVar8 != pnVar1) {
      lVar10 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                (pnVar8,pnVar1,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pnVar1 - (long)pnVar8 < 0x601) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                  (pnVar8,pnVar1);
      }
      else {
        pnVar15 = pnVar8 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                  (pnVar8,pnVar15);
        for (; pnVar15 != pnVar1; pnVar15 = pnVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,__gnu_cxx::__ops::_Val_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                    (pnVar15);
        }
      }
    }
    local_148.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pnVar8 = (sets->
             super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      local_c8 = (undefined1  [8])0x0;
      pvStack_c0 = (pointer)0x0;
      local_b8 = (_Base_ptr)0x0;
      pnVar1 = pnVar8 + uVar4;
      p_Var5 = *(_Base_ptr *)((long)&(pnVar1->non_dummy_edges)._M_t._M_impl + 0x18);
      while (p_Var5 != (_Rb_tree_node_base *)((long)&(pnVar1->non_dummy_edges)._M_t._M_impl + 8U)) {
        if ((_Base_ptr)pvStack_c0 == local_b8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_c8,(iterator)pvStack_c0,
                     (int *)(p_Var5 + 1));
          pnVar8 = (sets->
                   super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *(_Rb_tree_color *)pvStack_c0 = p_Var5[1]._M_color;
          pvStack_c0 = (pointer)((long)pvStack_c0 + 4);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        pnVar1 = pnVar8 + uVar4;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&local_148,(value_type *)local_c8);
      if (local_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c8);
      }
      uVar4 = uVar4 + 1;
      pnVar8 = (sets->
               super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)(((long)(sets->
                                    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar8 >> 5)
                            * -0x5555555555555555));
    local_168.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_148.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_1f0 = (ulong)((long)((local_148.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)((local_148.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
      lVar10 = 0;
      lVar16 = 0;
      uVar4 = 0;
      do {
        uVar17 = *(long *)((long)&((local_148.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish + lVar16) -
                 *(long *)((long)&((local_148.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar16) >> 2;
        if (uVar17 == (long)(int)local_1f0) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(&local_168,
                      (value_type *)
                      ((long)&((local_148.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar16));
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::push_back(&local_188,
                      (value_type *)
                      ((long)&(((sets->
                                super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                )._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices).
                              _M_t._M_impl + lVar10));
        }
        else {
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::push_back(&local_1c8,&local_168);
          std::
          vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
          ::push_back(&local_128,&local_188);
          local_c8 = (undefined1  [8])0x0;
          pvStack_c0 = (pointer)0x0;
          local_b8 = (_Base_ptr)0x0;
          local_1e8.
          super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1e8.
          super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1e8.
          super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator=(&local_168,
                      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_c8);
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::operator=(&local_188,&local_1e8);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(&local_168,
                      (value_type *)
                      ((long)&((local_148.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar16));
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::push_back(&local_188,
                      (value_type *)
                      ((long)&(((sets->
                                super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                )._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices).
                              _M_t._M_impl + lVar10));
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::~vector(&local_1e8);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_c8);
          local_1f0 = uVar17;
        }
        uVar4 = uVar4 + 1;
        lVar16 = lVar16 + 0x18;
        lVar10 = lVar10 + 0x60;
      } while (uVar4 < (ulong)(((long)local_148.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    std::
    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
    ::push_back(&local_1c8,&local_168);
    std::
    vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
    ::push_back(&local_128,&local_188);
    if (((local_1c8.
          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        ((local_1c8.
          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar10 = 0;
      uVar4 = 0;
      do {
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::push_back(&local_1a8,
                    (value_type *)
                    ((long)&((((local_128.
                                super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                              )._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices)._M_t.
                            _M_impl + lVar10));
        uVar4 = uVar4 + 1;
        lVar10 = lVar10 + 0x60;
      } while (uVar4 < (ulong)(((long)((local_1c8.
                                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_1c8.
                                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    if (1 < (ulong)(((long)local_1c8.
                           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1c8.
                           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      uVar4 = 1;
      do {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&local_1e8,
                 local_1c8.
                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::vector(&local_60,
                 local_128.
                 super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4);
        if (local_1e8.
            super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1e8.
            super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar17 = 0;
          do {
            local_d0 = uVar17;
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_f0,
                       (vector<int,_std::allocator<int>_> *)
                       (&((local_1e8.
                           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                           ._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices)._M_t.
                         _M_impl.field_0x0 + uVar17 * 0x18));
            pnVar8 = local_60.
                     super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_c8,
                     (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)pnVar8);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree(&local_98,&(pnVar8->non_dummy_edges)._M_t);
            if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar3 = true;
              bVar2 = true;
              uVar17 = 0;
              do {
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::vector(&local_108,
                         local_1c8.
                         super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar17);
                if (local_108.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_108.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar9 = 0;
                  do {
                    std::vector<int,_std::allocator<int>_>::vector
                              (&local_48,
                               local_108.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar9);
                    if ((long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start != 0) {
                      uVar6 = (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2;
                      uVar7 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2;
                      uVar11 = 0;
                      uVar13 = 0;
                      iVar12 = 0;
LAB_001561dd:
                      uVar14 = (ulong)(int)uVar13;
                      if (uVar7 <= uVar14) {
                        bVar18 = false;
                        goto LAB_0015621b;
                      }
                      while (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar14] <=
                             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar11]) {
                        if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11] ==
                            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar14]) {
                          iVar12 = iVar12 + 1;
                          bVar18 = uVar6 == (long)iVar12;
                          bVar2 = bVar3;
                          if (bVar18) {
                            bVar3 = false;
                            bVar2 = false;
                          }
                          goto LAB_00156218;
                        }
                        uVar14 = uVar14 + 1;
                        if (uVar7 <= uVar14) goto code_r0x001561f9;
                      }
                      goto LAB_0015622d;
                    }
LAB_00156228:
                    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_0015622d:
                      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
                    }
                    if (!bVar2) break;
                    uVar9 = uVar9 + 1;
                    uVar6 = ((long)local_108.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_108.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555;
                  } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
                }
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::~vector(&local_108);
              } while ((bVar2) && (uVar17 = uVar17 + 1, uVar17 < uVar4));
              if (bVar2) {
                std::
                vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                ::push_back(&local_1a8,(value_type *)local_c8);
              }
            }
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_98);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_c8);
            if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            uVar17 = local_d0 + 1;
            uVar9 = ((long)local_1e8.
                           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1e8.
                           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          } while (uVar17 <= uVar9 && uVar9 - uVar17 != 0);
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&local_60);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_1e8);
        uVar4 = uVar4 + 1;
        uVar17 = ((long)local_1c8.
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1c8.
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar4 <= uVar17 && uVar17 - uVar4 != 0);
    }
    __return_storage_ptr__ = local_d8;
    (local_d8->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_1a8.
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_d8->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_1a8.
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_d8->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a8.
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a8.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ::~vector(&local_188);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_168);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_148);
  }
  std::
  vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ::~vector(&local_128);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_1c8);
  std::
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ::~vector(&local_1a8);
  return __return_storage_ptr__;
code_r0x001561f9:
  bVar18 = false;
LAB_00156218:
  uVar13 = uVar14 & 0xffffffff;
LAB_0015621b:
  if ((bVar18) || (uVar11 = uVar11 + 1, uVar6 <= uVar11)) goto LAB_00156228;
  goto LAB_001561dd;
}

Assistant:

std::vector<non_dummy_vertices_and_edges>
    find_maximal_subsets_of_ndve(std::vector<non_dummy_vertices_and_edges> sets)
    {

        std::vector<non_dummy_vertices_and_edges> output;
        // in regular buckets we keep the sets of edges; they are used in the main algorithm
        std::vector<std::vector<std::vector<int>>> buckets;
        // in buckets_ndve we keep together edges and vertices; these will be used for output
        std::vector<std::vector<non_dummy_vertices_and_edges>> buckets_ndve;


        if (sets.size() <= 1)
        { return sets; }

        // sort the vector by descending length
        std::sort(sets.begin(), sets.end(),
                  [](non_dummy_vertices_and_edges x, non_dummy_vertices_and_edges y) -> int {
                      return (x.non_dummy_edges.size() > y.non_dummy_edges.size());
                  });

        // transform sets into vectors:
        std::vector<std::vector<int>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int> vec;
            for (std::set<int>::iterator j = sets[i].non_dummy_edges.begin(); j != sets[i].non_dummy_edges.end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        int length = vectors[0].size();
        std::vector<std::vector<int>> bucket; //current bucket
        std::vector<non_dummy_vertices_and_edges> bucket_ndve; //current bucket

        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
                bucket_ndve.push_back(sets[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                buckets_ndve.push_back(bucket_ndve);
                std::vector<std::vector<int>> newbucked;
                std::vector<non_dummy_vertices_and_edges> newbucked_ndve;
                bucket = newbucked;
                bucket_ndve = newbucked_ndve;
                bucket.push_back(vectors[i]);
                bucket_ndve.push_back(sets[i]);
            }
        }
        buckets.push_back(bucket);
        buckets_ndve.push_back(bucket_ndve);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            //output.push_back(buckets[0][i]);
            output.push_back(buckets_ndve[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int>> currentBucket = buckets[i];
            std::vector<non_dummy_vertices_and_edges> currentBucket_ndve = buckets_ndve[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int> currentSet = currentBucket[a]; // this set can be potentially added
                non_dummy_vertices_and_edges currentSet_ndve = currentBucket_ndve[a];


                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    if (testMatches == currentSet.size())
                                    {
                                        // SAME LENGTH
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet_ndve); }
            }//a
        }//i


        return output;
    }